

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clients_map.c
# Opt level: O2

piga_status piga_clients_map_add(piga_clients_map *map,int shm_key,char *name,int name_length)

{
  long lVar1;
  undefined8 in_RAX;
  undefined8 uVar2;
  long lVar3;
  piga_status status;
  
  status = (piga_status)((ulong)in_RAX >> 0x20);
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x60 == 0x360) {
      return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP;
    }
    lVar1 = lVar3 + 0x60;
  } while (*(long *)(map->items[0].name + lVar3 + 0x58) != 0);
  memcpy(map->items[0].name + lVar3,name,(long)name_length);
  *(int *)(map->items[0].name + lVar3 + 0x50) = shm_key;
  uVar2 = piga_event_queue_connect_to_shm(shm_key,map->items[0].name + lVar3 + 0x54,&status);
  if (status == PIGA_STATUS_OK) {
    *(undefined8 *)(map->items[0].name + lVar3 + 0x58) = uVar2;
  }
  return status;
}

Assistant:

piga_status piga_clients_map_add(piga_clients_map* map, int shm_key, const char* name, int name_length)
{
    for(size_t i = 0; i < PIGA_CLIENTS_MAP_ITEM_NUMBER; ++i) {
        if(map->items[i].queue == 0) {
            // This item is still unused.
            piga_clients_map_item_set_name(&map->items[i], name, name_length);
            piga_clients_map_item_set_shm_key(&map->items[i], shm_key);
            
            // Receive the queue.
            piga_status status;
            piga_event_queue *queue;
            queue = piga_event_queue_connect_to_shm(shm_key, &(map->items[i].shm_id), &status);
            if(status != PIGA_STATUS_OK)
                return status;
            
            piga_clients_map_item_set_queue(&map->items[i], queue);
            return PIGA_STATUS_OK;
        }
    }
    return PIGA_ERROR_NO_SPACE_LEFT_IN_MAP; 
}